

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

bool __thiscall
Inline::TryGetCallApplyCallbackTargetInlineeData
          (Inline *this,FunctionJITTimeInfo *inlinerData,Instr *callInstr,Instr *callApplyLdInstr,
          FunctionJITTimeInfo **inlineeData,Instr **callbackDefInstr,bool isCallInstanceFunction)

{
  ushort profileId;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  Instr *pIVar5;
  undefined4 *puVar6;
  FunctionJITTimeInfo *pFVar7;
  JITTimeFunctionBody *pJVar8;
  char16 *pcVar9;
  char16 *pcVar10;
  wchar local_98 [4];
  char16 debugStringBuffer [42];
  
  if (isCallInstanceFunction) {
    pIVar5 = TryGetCallbackDefInstrForCallInstanceFunction(this,callInstr);
  }
  else {
    pIVar5 = TryGetCallbackDefInstrForCallApplyTarget(this,callApplyLdInstr);
  }
  *callbackDefInstr = pIVar5;
  if (pIVar5 != (Instr *)0x0) {
    if (pIVar5->m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    profileId = *(ushort *)&pIVar5[1]._vptr_Instr;
    pFVar7 = JITTimeWorkItem::GetJITTimeInfo((*callbackDefInstr)->m_func->m_workItem);
    pFVar7 = FunctionJITTimeInfo::GetCallbackInlinee(pFVar7,profileId);
    *inlineeData = pFVar7;
    pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
    uVar3 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
    pFVar7 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
    uVar4 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar7);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlineCallbacksPhase,uVar3,uVar4);
    if (!bVar2) {
      pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
      uVar3 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
      pFVar7 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
      uVar4 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar7);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,InlineCallbacksPhase,uVar3,uVar4);
      if (!bVar2) goto LAB_0055992c;
    }
    pJVar8 = FunctionJITTimeInfo::GetBody(inlinerData);
    pcVar9 = JITTimeFunctionBody::GetDisplayName(pJVar8);
    pcVar10 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_98);
    Output::Print(L"INLINING : Found callback def instr for call/apply target callback at\tCallSite: %d\tCaller: %s (%s)\n"
                  ,(ulong)profileId,pcVar9,pcVar10);
    Output::Flush();
  }
LAB_0055992c:
  return pIVar5 != (Instr *)0x0;
}

Assistant:

bool
Inline::TryGetCallApplyCallbackTargetInlineeData(
    const FunctionJITTimeInfo* inlinerData,
    IR::Instr * callInstr,
    IR::Instr * callApplyLdInstr,
    const FunctionJITTimeInfo ** inlineeData,
    IR::Instr ** callbackDefInstr,
    bool isCallInstanceFunction)
{
    // Try to find a callback def instr for the method.
    if (isCallInstanceFunction)
    {
        *callbackDefInstr = TryGetCallbackDefInstrForCallInstanceFunction(callInstr);
    }
    else
    {
        *callbackDefInstr = TryGetCallbackDefInstrForCallApplyTarget(callApplyLdInstr);
    }

    if (*callbackDefInstr == nullptr)
    {
        return false;
    }

    Js::ProfileId callSiteId = static_cast<Js::ProfileId>((*callbackDefInstr)->AsProfiledInstr()->u.profileId);
    *inlineeData = (*callbackDefInstr)->m_func->GetWorkItem()->GetJITTimeInfo()->GetCallbackInlinee(callSiteId);

#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    INLINE_CALLBACKS_TRACE(_u("INLINING : Found callback def instr for call/apply target callback at\tCallSite: %d\tCaller: %s (%s)\n"),
        callSiteId, inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
#endif

    return true;
}